

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_strings.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  undefined1 local_88 [8];
  string buffer;
  undefined1 local_60 [8];
  string second;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string first;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_28,"Hello ",&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"World",(allocator<char> *)(buffer.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(buffer.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_88);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_28);
  return 0;
}

Assistant:

int main() {

  std::string first = "Hello ";
  std::string second = "World";
  std::string buffer = first + second;

  std::cout << buffer << "\n";
}